

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O3

void expandSeeds(tree_t *tree,uint8_t *salt,uint repIndex,picnic_instance_t *params)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  bitset_word_t *pbVar4;
  uint uVar5;
  ulong __n;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint16_t data0_le;
  uint16_t data2_le;
  uint16_t data1_le;
  uint8_t *tmp_ptr [4];
  uint8_t tmp [256];
  undefined6 in_stack_fffffffffffffaa8;
  BitSequence in_stack_fffffffffffffaae;
  undefined1 in_stack_fffffffffffffaaf;
  ulong local_548;
  undefined2 local_522;
  undefined2 local_520;
  undefined2 local_51e;
  uint local_51c;
  uint8_t *local_518;
  picnic_instance_t *local_510;
  ulong local_508;
  uint local_4fc;
  BitSequence *local_4f8;
  uint8_t *puStack_4f0;
  uint8_t *puStack_4e8;
  uint8_t *puStack_4e0;
  BitSequence *local_4d0;
  BitSequence *local_4c8 [4];
  undefined1 local_4a8 [32];
  undefined1 local_488 [32];
  BitSequence local_468 [64];
  undefined1 local_428 [64];
  undefined1 local_3e8 [64];
  undefined1 local_3a8 [64];
  Keccak_HashInstancetimes4 local_368;
  
  local_4c8[0] = local_468;
  bVar2 = params->seed_size;
  __n = (ulong)bVar2;
  local_4c8[1] = local_428;
  local_4c8[2] = local_3e8;
  uVar11 = 4;
  local_4c8[3] = local_3a8;
  local_4d0 = local_468 + __n;
  uVar3 = (tree->numNodes >> 1) - 1;
  local_508 = 2;
  if (uVar3 < 2) {
    local_508 = (ulong)uVar3;
  }
  uVar7 = 0;
  lVar12 = 0;
  uVar6 = 0;
  local_548 = (ulong)((int)local_508 + 1);
  pbVar4 = tree->haveNodeExists;
  local_518 = salt;
  local_510 = params;
  do {
    if ((pbVar4[uVar6 >> 5] >> (uVar7 & 0x3f) & 2) != 0) {
      hashSeed(local_468,tree->nodes + lVar12,local_518,(uint8_t)repIndex,(uint)uVar6,
               (uint)local_510,
               (picnic_instance_t *)
               CONCAT17(in_stack_fffffffffffffaaf,
                        CONCAT16(in_stack_fffffffffffffaae,in_stack_fffffffffffffaa8)));
      pbVar4 = tree->haveNodeExists;
      uVar8 = 2L << ((ulong)((int)uVar11 - 2) & 0x3f);
      if ((pbVar4[uVar6 >> 4] & uVar8) == 0) {
        memcpy(tree->nodes + lVar12 * 2 + __n,local_468,__n);
        pbVar4 = tree->haveNodeExists;
        pbVar4[uVar6 >> 4] = pbVar4[uVar6 >> 4] | uVar8;
      }
      uVar8 = uVar7 + 2 >> 5;
      if (((uint)(pbVar4[uVar8] >> (uVar11 & 0x3f)) & 3) == 1) {
        memcpy(tree->nodes + lVar12 * 2 + (ulong)((uint)bVar2 * 2),local_4d0,__n);
        pbVar4 = tree->haveNodeExists;
        pbVar4[uVar8] = pbVar4[uVar8] | 2L << (uVar11 & 0x3f);
      }
    }
    lVar12 = lVar12 + __n;
    uVar6 = uVar6 + 1;
    uVar7 = uVar7 + 2;
    uVar11 = uVar11 + 4;
  } while (local_548 != uVar6);
  local_4fc = uVar3 & 0xfffffffc;
  if ((int)uVar6 - 1U < local_4fc) {
    local_4a8 = vpbroadcastq_avx512vl();
    uVar10 = 2;
    if (uVar3 < 2) {
      uVar10 = uVar3;
    }
    uVar11 = (ulong)(uVar10 << 2);
    local_488 = vpbroadcastq_avx512vl();
    local_51c = (int)local_508 * 2 + 4;
    do {
      bVar2 = local_510->seed_size;
      uVar6 = (ulong)bVar2;
      if (local_510->digest_size == ' ') {
        uVar9 = 0x540;
        uVar10 = 0x100;
      }
      else {
        uVar9 = 0x440;
        uVar10 = 0x200;
      }
      Keccak_HashInitializetimes4(&local_368,uVar9,uVar10,0,'\x1f');
      local_4f8 = (BitSequence *)local_4a8._0_8_;
      puStack_4f0 = (uint8_t *)local_4a8._8_8_;
      puStack_4e8 = (uint8_t *)local_4a8._16_8_;
      puStack_4e0 = (uint8_t *)local_4a8._24_8_;
      Keccak_HashUpdatetimes4(&local_368,&local_4f8,8);
      uVar10 = (uint)local_548;
      puStack_4e0 = tree->nodes;
      local_4f8 = puStack_4e0 + uVar6 * local_548;
      puStack_4f0 = puStack_4e0 + (uVar10 + 1) * uVar6;
      puStack_4e8 = puStack_4e0 + (uVar10 + 2) * uVar6;
      puStack_4e0 = puStack_4e0 + (uVar10 + 3) * uVar6;
      Keccak_HashUpdatetimes4(&local_368,&local_4f8,(ulong)((uint)bVar2 * 8));
      local_4f8 = (BitSequence *)local_488._0_8_;
      puStack_4f0 = (uint8_t *)local_488._8_8_;
      puStack_4e8 = (uint8_t *)local_488._16_8_;
      puStack_4e0 = (uint8_t *)local_488._24_8_;
      Keccak_HashUpdatetimes4(&local_368,&local_4f8,0x100);
      local_4f8 = (BitSequence *)local_4a8._0_8_;
      puStack_4f0 = (uint8_t *)local_4a8._8_8_;
      puStack_4e8 = (uint8_t *)local_4a8._16_8_;
      puStack_4e0 = (uint8_t *)local_4a8._24_8_;
      Keccak_HashUpdatetimes4(&local_368,&local_4f8,0x10);
      local_4f8 = &stack0xfffffffffffffaae;
      puStack_4f0 = (uint8_t *)&local_51e;
      in_stack_fffffffffffffaae = (BitSequence)local_548;
      in_stack_fffffffffffffaaf = (undefined1)(local_548 >> 8);
      local_522 = (undefined2)(uVar10 + 3);
      puStack_4e8 = (uint8_t *)&local_520;
      local_51e = (undefined2)(uVar10 + 1);
      local_520 = (undefined2)(uVar10 + 2);
      puStack_4e0 = (uint8_t *)&local_522;
      Keccak_HashUpdatetimes4(&local_368,&local_4f8,0x10);
      Keccak_HashFinaltimes4(&local_368,(BitSequence **)0x0);
      Keccak_HashSqueezetimes4(&local_368,local_4c8,(ulong)bVar2 << 4);
      uVar6 = (ulong)(uVar10 + 4);
      if (uVar10 < 0xfffffffc) {
        lVar12 = 0;
        pbVar4 = tree->haveNodeExists;
        uVar9 = local_51c;
        local_508 = uVar11;
        do {
          uVar5 = uVar9 - 1;
          if ((pbVar4[uVar5 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) != 0) {
            uVar7 = uVar11 + 7 + lVar12;
            uVar8 = uVar7 >> 6 & 0x3ffffff;
            if ((pbVar4[uVar8] >> (uVar7 & 0x3f) & 1) == 0) {
              memcpy(tree->nodes + uVar5 * __n,*(void **)((long)local_4c8 + lVar12 * 2),__n);
              pbVar4 = tree->haveNodeExists;
              pbVar4[uVar8] = pbVar4[uVar8] | 1L << (uVar7 & 0x3f);
              uVar11 = local_508;
            }
            uVar7 = uVar11 + 8 + lVar12;
            if (((uint)(pbVar4[uVar7 >> 6 & 0x3ffffff] >> ((byte)uVar7 & 0x3c)) & 3) == 1) {
              memcpy(tree->nodes + uVar9 * __n,
                     (void *)(*(long *)((long)local_4c8 + lVar12 * 2) + __n),__n);
              uVar5 = (int)uVar11 + 9 + (int)lVar12;
              pbVar4 = tree->haveNodeExists;
              pbVar4[uVar5 >> 6] = pbVar4[uVar5 >> 6] | 1L << ((byte)uVar5 & 0x3d);
            }
          }
          local_548 = local_548 + 1;
          lVar12 = lVar12 + 4;
          uVar9 = uVar9 + 2;
        } while (local_548 < uVar6);
      }
      local_51c = local_51c + 8;
      uVar11 = uVar11 + 0x10;
      local_548 = uVar6;
    } while (uVar10 + 4 <= local_4fc);
  }
  uVar10 = (uint)local_548;
  if (uVar10 <= uVar3) {
    uVar9 = uVar10 * 4 + 5;
    pbVar4 = tree->haveNodeExists;
    uVar10 = uVar10 * 2;
    do {
      uVar5 = uVar10 + 1;
      if ((pbVar4[uVar5 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) != 0) {
        hashSeed(local_468,tree->nodes + local_548 * __n,local_518,(uint8_t)repIndex,(uint)local_548
                 ,(uint)local_510,
                 (picnic_instance_t *)
                 CONCAT17(in_stack_fffffffffffffaaf,
                          CONCAT16(in_stack_fffffffffffffaae,in_stack_fffffffffffffaa8)));
        pbVar4 = tree->haveNodeExists;
        uVar1 = uVar9 - 2;
        if ((pbVar4[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
          memcpy(tree->nodes + uVar5 * __n,local_468,__n);
          pbVar4 = tree->haveNodeExists;
          pbVar4[uVar1 >> 6] = pbVar4[uVar1 >> 6] | 1L << ((ulong)uVar1 & 0x3f);
        }
        if (((uint)(pbVar4[uVar9 - 1 >> 6] >> ((byte)(uVar9 - 1) & 0x3c)) & 3) == 1) {
          memcpy(tree->nodes + (uVar10 + 2) * __n,local_4d0,__n);
          pbVar4 = tree->haveNodeExists;
          pbVar4[uVar9 >> 6] = pbVar4[uVar9 >> 6] | 1L << ((byte)uVar9 & 0x3d);
        }
      }
      uVar5 = (uint)local_548 + 1;
      local_548 = (ulong)uVar5;
      uVar9 = uVar9 + 4;
      uVar10 = uVar10 + 2;
    } while (uVar5 <= uVar3);
  }
  return;
}

Assistant:

static void expandSeeds(tree_t* tree, uint8_t* salt, unsigned int repIndex,
                        const picnic_instance_t* params) {
  const size_t seed_size = params->seed_size;

  uint8_t tmp[4 * 2 * MAX_SEED_SIZE_BYTES];
  uint8_t* tmp_ptr[4] = {&tmp[0], &tmp[2 * MAX_SEED_SIZE_BYTES], &tmp[2 * 2 * MAX_SEED_SIZE_BYTES],
                         &tmp[3 * 2 * MAX_SEED_SIZE_BYTES]};

  /* Walk the tree, expanding seeds where possible. Compute children of
   * non-leaf nodes. */
  const unsigned int lastNonLeaf = getParent(tree->numNodes - 1);
  unsigned int i                 = 0;
  /* expand the first 4 seeds*/
  for (; i <= MIN(2, lastNonLeaf); i++) {
    if (!haveNode(tree, i)) {
      continue;
    }

    hashSeed(tmp, &tree->nodes[i * seed_size], salt, HASH_PREFIX_1, repIndex, i, params);

    if (!haveNode(tree, 2 * i + 1)) {
      /* left child = H_left(seed_i || salt || t || i) */
      memcpy(&tree->nodes[(2 * i + 1) * seed_size], tmp, seed_size);
      markNode(tree, 2 * i + 1);
    }

    /* The last non-leaf node will only have a left child when there are an odd number of leaves */
    if (existsNotHaveNode(tree, 2 * i + 2)) {
      /* right child = H_right(seed_i || salt || t || i)  */
      memcpy(&tree->nodes[(2 * i + 2) * seed_size], tmp + seed_size, seed_size);
      markNode(tree, 2 * i + 2);
    }
  }
  /* now hash in groups of 4 for faster hashing */
  for (; i <= lastNonLeaf / 4 * 4; i += 4) {
    hashSeed_x4(tmp_ptr, tree, salt, HASH_PREFIX_1, repIndex, i, params);

    for (unsigned int j = i; j < i + 4; j++) {
      if (!haveNode(tree, j)) {
        continue;
      }
      if (!haveNode(tree, 2 * j + 1)) {
        /* left child = H_left(seed_i || salt || t || j) */
        memcpy(&tree->nodes[(2 * j + 1) * seed_size], tmp_ptr[j - i], seed_size);
        markNode(tree, 2 * j + 1);
      }

      /* The last non-leaf node will only have a left child when there are an odd number of leaves
       */
      if (existsNotHaveNode(tree, 2 * j + 2)) {
        /* right child = H_right(seed_i || salt || t || j)  */
        memcpy(&tree->nodes[(2 * j + 2) * seed_size], tmp_ptr[j - i] + seed_size, seed_size);
        markNode(tree, 2 * j + 2);
      }
    }
  }
  /* handle last few, which are not a multiple of 4 */
  for (; i <= lastNonLeaf; i++) {
    if (!haveNode(tree, i)) {
      continue;
    }

    hashSeed(tmp, &tree->nodes[i * seed_size], salt, HASH_PREFIX_1, repIndex, i, params);

    if (!haveNode(tree, 2 * i + 1)) {
      /* left child = H_left(seed_i || salt || t || i) */
      memcpy(&tree->nodes[(2 * i + 1) * seed_size], tmp, seed_size);
      markNode(tree, 2 * i + 1);
    }

    /* The last non-leaf node will only have a left child when there are an odd number of leaves */
    if (existsNotHaveNode(tree, 2 * i + 2)) {
      /* right child = H_right(seed_i || salt || t || i)  */
      memcpy(&tree->nodes[(2 * i + 2) * seed_size], tmp + seed_size, seed_size);
      markNode(tree, 2 * i + 2);
    }
  }
}